

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEvaluator.cpp
# Opt level: O3

void __thiscall
simpleExpressionEvaluator::ExpressionEvaluator::ExpressionEvaluator(ExpressionEvaluator *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_48;
  
  (this->_expression)._M_dataplus._M_p = (pointer)&(this->_expression).field_2;
  (this->_expression)._M_string_length = 0;
  (this->_expression).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->_variableTable)._table._M_t._M_impl.super__Rb_tree_header;
  (this->_variableTable)._table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_variableTable)._table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_variableTable)._table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_variableTable)._table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_variableTable)._table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_48._M_impl.super__Rb_tree_header;
  local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_impl._0_8_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           *)&this->_variableTable);
  if (local_48._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (this->_variableTable)._table._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_48._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->_variableTable)._table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_48._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->_variableTable)._table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_48._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->_variableTable)._table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_48._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_48._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (this->_variableTable)._table._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_48._M_impl.super__Rb_tree_header._M_node_count;
    local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&local_48);
  this->_index = -1;
  return;
}

Assistant:

ExpressionEvaluator::ExpressionEvaluator()
{
	_variableTable = VariableTable();
	_index = -1;
}